

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_logical_and_or(JSParseState *s,int op,int parse_flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (op == -0x5f) {
    iVar1 = js_parse_expr_binary(s,8,parse_flags);
  }
  else {
    iVar1 = js_parse_logical_and_or(s,-0x5f,parse_flags);
  }
  iVar3 = -1;
  if ((iVar1 == 0) && (iVar3 = 0, (s->token).val == op)) {
    iVar3 = -1;
    iVar1 = new_label_fd(s->cur_func,-1);
    do {
      iVar2 = next_token(s);
      if (iVar2 != 0) {
        return -1;
      }
      emit_op(s,'\x11');
      emit_goto(s,(op != -0x5f) + 0x69,iVar1);
      emit_op(s,'\x0e');
      if (op == -0x5f) {
        iVar2 = js_parse_expr_binary(s,8,parse_flags & 0xfffffffbU);
      }
      else {
        iVar2 = js_parse_logical_and_or(s,-0x5f,parse_flags & 0xfffffffbU);
      }
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = (s->token).val;
    } while (iVar2 == op);
    if (iVar2 == -0x5a) {
      js_parse_error(s,"cannot mix ?? with && or ||");
    }
    else {
      emit_label(s,iVar1);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static __exception int js_parse_logical_and_or(JSParseState *s, int op,
                                               int parse_flags)
{
    int label1;

    if (op == TOK_LAND) {
        if (js_parse_expr_binary(s, 8, parse_flags))
            return -1;
    } else {
        if (js_parse_logical_and_or(s, TOK_LAND, parse_flags))
            return -1;
    }
    if (s->token.val == op) {
        label1 = new_label(s);

        for(;;) {
            if (next_token(s))
                return -1;
            emit_op(s, OP_dup);
            emit_goto(s, op == TOK_LAND ? OP_if_false : OP_if_true, label1);
            emit_op(s, OP_drop);

            if (op == TOK_LAND) {
                if (js_parse_expr_binary(s, 8, parse_flags & ~PF_ARROW_FUNC))
                    return -1;
            } else {
                if (js_parse_logical_and_or(s, TOK_LAND,
                                            parse_flags & ~PF_ARROW_FUNC))
                    return -1;
            }
            if (s->token.val != op) {
                if (s->token.val == TOK_DOUBLE_QUESTION_MARK)
                    return js_parse_error(s, "cannot mix ?? with && or ||");
                break;
            }
        }

        emit_label(s, label1);
    }
    return 0;
}